

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O3

void x11_free_fake_auth(X11FakeAuth *auth)

{
  void *ptr;
  uchar *ptr_00;
  tree234 *t;
  
  if (auth->data == (uchar *)0x0) {
    ptr_00 = (uchar *)0x0;
  }
  else {
    smemclr(auth->data,(long)auth->datalen);
    ptr_00 = auth->data;
  }
  safefree(ptr_00);
  safefree(auth->protoname);
  safefree(auth->datastring);
  safefree(auth->xa1_firstblock);
  t = auth->xdmseen;
  if (t != (tree234 *)0x0) {
    while( true ) {
      ptr = delpos234(t,0);
      if (ptr == (void *)0x0) break;
      safefree(ptr);
      t = auth->xdmseen;
    }
    freetree234(auth->xdmseen);
  }
  safefree(auth);
  return;
}

Assistant:

void x11_free_fake_auth(struct X11FakeAuth *auth)
{
    if (auth->data)
        smemclr(auth->data, auth->datalen);
    sfree(auth->data);
    sfree(auth->protoname);
    sfree(auth->datastring);
    sfree(auth->xa1_firstblock);
    if (auth->xdmseen != NULL) {
        struct XDMSeen *seen;
        while ((seen = delpos234(auth->xdmseen, 0)) != NULL)
            sfree(seen);
        freetree234(auth->xdmseen);
    }
    sfree(auth);
}